

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPla.c
# Opt level: O3

int Io_ReadPlaSelfSubsumption(word **pCs,int nCubes,int nWords,Vec_Bit_t *vMarks)

{
  ulong *puVar1;
  uint uVar2;
  uint uVar3;
  word *pwVar4;
  word *pwVar5;
  byte bVar6;
  int *piVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  size_t __size;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  bool bVar25;
  int local_94;
  
  iVar11 = nCubes >> 5;
  if (vMarks->nCap < nCubes) {
    iVar13 = (iVar11 + 1) - (uint)((nCubes & 0x1fU) == 0);
    __size = (long)iVar13 << 2;
    if (vMarks->pArray == (int *)0x0) {
      piVar7 = (int *)malloc(__size);
    }
    else {
      piVar7 = (int *)realloc(vMarks->pArray,__size);
    }
    vMarks->pArray = piVar7;
    if (piVar7 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                    ,0x163,"void Vec_BitGrow(Vec_Bit_t *, int)");
    }
    vMarks->nCap = iVar13 * 0x20;
  }
  uVar10 = (uint)((nCubes & 0x1fU) != 0);
  iVar13 = iVar11 + uVar10;
  if (iVar13 != 0 && SCARRY4(iVar11,uVar10) == iVar13 < 0) {
    memset(vMarks->pArray,0,(ulong)(iVar13 - 1) * 4 + 4);
  }
  vMarks->nSize = iVar13 * 0x20;
  if (nCubes < 1) {
    return 0;
  }
  uVar18 = (ulong)(uint)nWords;
  uVar16 = (ulong)(uint)nCubes;
  uVar10 = 0xffffffff;
  uVar19 = 1;
  local_94 = 0;
  uVar20 = 0;
LAB_003325c5:
  if ((long)vMarks->nSize <= (long)uVar20) {
LAB_003328df:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                  ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
  }
  piVar7 = vMarks->pArray;
  uVar12 = uVar20 >> 5 & 0x7ffffff;
  uVar2 = piVar7[uVar12];
  uVar21 = uVar20 + 1;
  if (uVar21 < uVar16 && (uVar2 >> ((uint)uVar20 & 0x1f) & 1) == 0) {
    uVar8 = uVar19;
    do {
      if (uVar8 == (uint)vMarks->nSize) goto LAB_003328df;
      uVar14 = uVar8 >> 5 & 0x7ffffff;
      uVar3 = piVar7[uVar14];
      if (((uVar3 >> ((uint)uVar8 & 0x1f) & 1) == 0) && (0 < nWords)) {
        pwVar4 = pCs[uVar20];
        pwVar5 = pCs[uVar8];
        bVar25 = true;
        uVar22 = 0;
        while( true ) {
          iVar11 = (int)uVar22 * -0x20;
          uVar17 = uVar22;
          while( true ) {
            uVar22 = uVar17 + 1;
            if (pwVar4[uVar17] != pwVar5[uVar17]) break;
            iVar11 = iVar11 + -0x20;
            uVar17 = uVar22;
            if (uVar22 == uVar18) {
              if (bVar25) goto LAB_003327a0;
              goto LAB_003327da;
            }
          }
          if (!bVar25) break;
          uVar17 = pwVar5[uVar17] ^ pwVar4[uVar17];
          uVar17 = uVar17 >> 1 & uVar17;
          uVar23 = uVar17 & 0x5555555555555555;
          if ((uVar23 ^ uVar23 - 1) <= uVar23 - 1) break;
          bVar25 = (uVar17 & 0x55555555) == 0;
          uVar17 = uVar23 >> 0x20;
          if (!bVar25) {
            uVar17 = uVar23;
          }
          iVar13 = (uint)bVar25 * 0x20;
          bVar25 = (uVar17 & 0x5555) != 0;
          uVar23 = uVar17 >> 0x10;
          if (bVar25) {
            uVar23 = uVar17;
          }
          iVar9 = iVar13 + 0x10;
          if (bVar25) {
            iVar9 = iVar13;
          }
          bVar25 = (uVar23 & 0x55) != 0;
          uVar17 = uVar23 >> 8;
          if (bVar25) {
            uVar17 = uVar23;
          }
          iVar13 = iVar9 + 8;
          if (bVar25) {
            iVar13 = iVar9;
          }
          bVar25 = (uVar17 & 0xf) != 0;
          uVar23 = uVar17 >> 4;
          if (bVar25) {
            uVar23 = uVar17;
          }
          iVar9 = iVar13 + 4;
          if (bVar25) {
            iVar9 = iVar13;
          }
          bVar25 = (uVar23 & 3) != 0;
          uVar15 = (uint)(uVar23 >> 2);
          if (bVar25) {
            uVar15 = (uint)uVar23;
          }
          iVar13 = iVar9 + 2;
          if (bVar25) {
            iVar13 = iVar9;
          }
          uVar10 = ((~uVar15 & 1) + iVar13 >> 1) - iVar11;
          bVar25 = false;
          if (uVar22 == uVar18) {
            uVar10 = (iVar13 + ((byte)((char)uVar15 + 1) & 1) >> 1) - iVar11;
LAB_003327da:
            if (((int)uVar10 < 0) || (nWords << 5 <= (int)uVar10)) {
              __assert_fail("iVar >= 0 && iVar < nWords*32",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadPla.c"
                            ,0xbd,"int Io_ReadPlaSelfSubsumption(word **, int, int, Vec_Bit_t *)");
            }
            uVar15 = uVar10 >> 5;
            uVar17 = (ulong)(uVar15 << 3);
            bVar6 = (char)uVar10 * '\x02';
            uVar22 = *(ulong *)((long)pwVar5 + uVar17);
            uVar23 = (ulong)((uint)(*(ulong *)((long)pwVar4 + uVar17) >> (bVar6 & 0x3f)) & 3) <<
                     (bVar6 & 0x3f);
            *(ulong *)((long)pwVar4 + uVar17) = *(ulong *)((long)pwVar4 + uVar17) ^ uVar23;
            uVar24 = (ulong)((uint)(uVar22 >> (bVar6 & 0x3f)) & 3) << (bVar6 & 0x3f);
            uVar22 = *(ulong *)((long)pwVar5 + uVar17);
            *(ulong *)((long)pwVar5 + uVar17) = uVar24 ^ uVar22;
            uVar17 = 0;
            goto LAB_00332832;
          }
        }
      }
LAB_003327a0:
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar16);
  }
  goto LAB_003328b6;
  while (uVar17 = uVar17 + 1, uVar18 != uVar17) {
LAB_00332832:
    if ((pwVar4[uVar17] & ~pwVar5[uVar17]) != 0) {
      uVar8 = 0;
      goto LAB_00332861;
    }
  }
  pwVar4[uVar15] = pwVar4[uVar15] ^ uVar23;
  piVar7[uVar14] = uVar3 | 1 << ((byte)uVar8 & 0x1f);
  goto LAB_0033288d;
  while (uVar8 = uVar8 + 1, uVar18 != uVar8) {
LAB_00332861:
    if ((pwVar5[uVar8] & ~pwVar4[uVar8]) != 0) {
      puVar1 = (ulong *)((long)pwVar4 + (ulong)(uVar15 * 8));
      *puVar1 = *puVar1 ^ uVar23;
      puVar1 = (ulong *)((long)pwVar5 + (ulong)(uVar15 * 8));
      *puVar1 = *puVar1 ^ uVar24;
      goto LAB_003328b6;
    }
  }
  pwVar5[uVar15] = uVar22;
  piVar7[uVar12] = uVar2 | 1 << ((byte)uVar20 & 0x1f);
LAB_0033288d:
  local_94 = local_94 + 1;
LAB_003328b6:
  uVar19 = uVar19 + 1;
  uVar20 = uVar21;
  if (uVar21 == uVar16) {
    return local_94;
  }
  goto LAB_003325c5;
}

Assistant:

int Io_ReadPlaSelfSubsumption( word ** pCs, int nCubes, int nWords, Vec_Bit_t * vMarks )
{
    int c1, c2, Res, Counter = 0, iVar = -1, Val0, Val1;
    Vec_BitFill( vMarks, nCubes, 0 );
    for ( c1 = 0; c1 < nCubes; c1++ )
        if ( !Vec_BitEntry(vMarks, c1) )
            for ( c2 = c1 + 1; c2 < nCubes; c2++ )
                if ( !Vec_BitEntry(vMarks, c2) )
                {
                    Res = Io_ReadPlaConsensus( pCs[c1], pCs[c2], nWords, &iVar );
                    if ( !Res )
                        continue;
                    assert( iVar >= 0  && iVar < nWords*32 );
                    Val0 = Abc_TtGetQua( pCs[c1], iVar );
                    Val1 = Abc_TtGetQua( pCs[c2], iVar );
                    // remove values
                    Abc_TtXorQua( pCs[c1], iVar, Val0 );
                    Abc_TtXorQua( pCs[c2], iVar, Val1 );
                    // check containment
                    if ( Abc_TtImply(pCs[c1], pCs[c2], nWords) )
                    {
                        Abc_TtXorQua( pCs[c1], iVar, Val0 );
                        Vec_BitWriteEntry( vMarks, c2, 1 );
                        Counter++;
                    }
                    else if ( Abc_TtImply(pCs[c2], pCs[c1], nWords) )
                    {
                        Abc_TtXorQua( pCs[c2], iVar, Val1 );
                        Vec_BitWriteEntry( vMarks, c1, 1 );
                        Counter++;
                        break;
                    }
                    else
                    {
                        Abc_TtXorQua( pCs[c1], iVar, Val0 );
                        Abc_TtXorQua( pCs[c2], iVar, Val1 );
                    }

/*
                    printf( "Var = %3d  ", iVar );
                    printf( "Cube0 = %d  ", Abc_TtGetQua(pCs[c1], iVar) );
                    printf( "Cube1 = %d  ", Abc_TtGetQua(pCs[c2], iVar) );
                    printf( "\n" );
                    Io_ReadPlaPrintCube( pCs[c1], 32 * nWords );
                    Io_ReadPlaPrintCube( pCs[c2], 32 * nWords );
                    printf( "\n" );
*/
                    break;
                }
    return Counter;
}